

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O1

int run_many_negation_range_tests_simpler(_Bool inplace)

{
  byte bVar1;
  rle16_t *prVar2;
  uint8_t typecode;
  uint8_t uVar3;
  _Bool _Var4;
  uint uVar5;
  run_container_t *src;
  int x;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  undefined7 in_register_00000039;
  run_container_t *run;
  ulong uVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int x_1;
  container_t *BO;
  _Bool result_should_be [65536];
  run_container_t *prStack_10080;
  ulong uStack_10078;
  ulong uStack_10070;
  uint uStack_10064;
  int iStack_10060;
  int iStack_1005c;
  uint uStack_10058;
  int iStack_10054;
  ulong uStack_10050;
  ulong uStack_10048;
  ulong uStack_10040;
  byte abStack_10038 [65544];
  
  uStack_10064 = (uint)CONCAT71(in_register_00000039,inplace);
  uVar16 = CONCAT71(in_register_00000039,inplace) & 0xffffffff;
  uVar7 = 1;
  do {
    printf("h=%d\n",uVar7);
    uVar8 = uVar7;
    if ((uint)uVar7 < 99) {
      uVar15 = (uint)uVar7 + 1;
      uStack_10070 = uVar7;
      do {
        uVar7 = uStack_10070;
        uVar8 = 0;
        printf("  k=%d\n",(ulong)uVar15);
        iStack_10060 = (int)(0x10000 / (long)(int)uVar15) + 1;
        uStack_10048 = (ulong)((int)uVar7 < (int)uVar15);
        do {
          uVar10 = (uint)uVar8;
          iStack_10054 = 0x10000 - uVar10;
          if (iStack_10054 < 2) {
            iStack_10054 = 1;
          }
          uStack_10058 = ~uVar10;
          iStack_1005c = uVar10 + 1;
          uVar7 = 0;
          uStack_10050 = uVar8;
          do {
            uVar11 = 0;
            uVar8 = uVar7 & 0xffffffff;
            uStack_10078 = uVar7;
            do {
              uStack_10040 = uVar11;
              src = run_container_create_given_capacity(iStack_10060);
              _assert_true(uStack_10048,"h < k",
                           "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                           ,0x67d);
              uVar11 = uStack_10050 & 0xffffffff;
              iVar6 = 0;
              uVar7 = uStack_10070;
              iVar9 = iStack_1005c;
              uVar10 = uStack_10058;
              do {
                if (iVar6 % (int)uVar15 == 0) {
                  uVar5 = (int)uVar7 + 1;
                  iVar13 = (int)uVar7 + iVar9;
                  if (0xffff < iVar13) {
                    iVar13 = 0;
                  }
                  src->runs[src->n_runs] =
                       (rle16_t)((uint)uVar11 & 0xffff | (iVar13 + uVar10) * 0x10000);
                  src->n_runs = src->n_runs + 1;
                  if (uVar5 == uVar15) {
                    uVar5 = (uint)uStack_10070;
                  }
                  uVar7 = (ulong)uVar5;
                }
                iVar6 = iVar6 + 1;
                uVar11 = (ulong)((uint)uVar11 + 1);
                uVar10 = uVar10 - 1;
                iVar9 = iVar9 + 1;
              } while (iStack_10054 != iVar6);
              prVar2 = src->runs;
              iVar9 = src->n_runs;
              iVar13 = (int)uVar8;
              uVar7 = 0;
              iVar6 = 0;
              do {
                uVar11 = CONCAT71((int7)(uVar11 >> 8),uStack_10078 <= uVar7);
                uVar10 = 0;
                iVar14 = iVar9 + -1;
                do {
                  if (iVar14 < (int)uVar10) {
                    uVar11 = (ulong)~uVar10;
                    break;
                  }
                  uVar5 = uVar10 + iVar14 >> 1;
                  if (prVar2[uVar5].value < (ushort)uVar7) {
                    uVar10 = uVar5 + 1;
                    bVar12 = true;
                  }
                  else if ((ushort)uVar7 < prVar2[uVar5].value) {
                    iVar14 = uVar5 - 1;
                    bVar12 = true;
                  }
                  else {
                    bVar12 = false;
                    uVar11 = (ulong)uVar5;
                  }
                } while (bVar12);
                bVar12 = true;
                iVar14 = (int)uVar11;
                if ((iVar14 < 0) &&
                   ((iVar14 == -1 ||
                    (uVar11 = (ulong)prVar2[-iVar14 - 2U].length,
                    (int)(uint)prVar2[-iVar14 - 2U].length <
                    (int)((int)uVar7 - (uint)prVar2[-iVar14 - 2U].value))))) {
                  bVar12 = false;
                }
                if (((long)uVar7 < (long)iVar13 && uStack_10078 <= uVar7) == bVar12) {
                  abStack_10038[uVar7] = 0;
                }
                else {
                  abStack_10038[uVar7] = 1;
                  iVar6 = iVar6 + 1;
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 != 0x10000);
              if ((char)uVar16 == '\0') {
                iVar9 = run_container_negation_range(src,(int)uStack_10078,iVar13,&prStack_10080);
                typecode = (uint8_t)iVar9;
              }
              else {
                iVar9 = run_container_negation_range_inplace
                                  (src,(int)uStack_10078,iVar13,&prStack_10080);
                typecode = (uint8_t)iVar9;
              }
              run = prStack_10080;
              uVar3 = typecode;
              if (typecode == '\x04') {
                run = *(run_container_t **)prStack_10080;
                uVar3 = *(uint8_t *)&prStack_10080->runs;
              }
              if (uVar3 == '\x03') {
                iVar9 = run_container_cardinality(run);
              }
              else {
                iVar9 = run->n_runs;
              }
              _assert_int_equal((long)iVar6,(long)iVar9,
                                "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                                ,0x6a1);
              uVar7 = 0;
              do {
                _Var4 = container_contains(prStack_10080,(uint16_t)uVar7,typecode);
                bVar1 = abStack_10038[uVar7];
                if ((_Bool)bVar1 != _Var4) {
                  printf("problem at index %d should be (but isnt) %d\n",uVar7 & 0xffffffff,
                         (ulong)(uint)bVar1);
                }
                _Var4 = container_contains(prStack_10080,(uint16_t)uVar7,typecode);
                _assert_int_equal((ulong)_Var4,(ulong)(uint)bVar1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                                  ,0x6ab);
                uVar7 = uVar7 + 1;
              } while (uVar7 != 0x10000);
              container_free(prStack_10080,typecode);
              uVar7 = uStack_10040;
              uVar16 = (ulong)uStack_10064;
              if ((char)uStack_10064 == '\0') {
                run_container_free(src);
              }
              uVar11 = (ulong)((int)uVar7 * 3 + 1);
              uVar10 = (int)uStack_10078 + (int)uVar7 * 3 + 1;
              uVar8 = (ulong)uVar10;
            } while ((int)uVar10 < 0x10000);
            uVar7 = uStack_10078 + 0x271d;
          } while (uStack_10078 < 0xd8e2);
          uVar10 = (uint)((double)(int)uStack_10050 * 2.7 + 1.0);
          uVar8 = (ulong)uVar10;
        } while ((int)uVar10 < 1000);
        uVar15 = (uint)((double)(int)uVar15 * 1.5 + 1.0);
        uVar8 = uStack_10070;
      } while ((int)uVar15 < 100);
    }
    uVar15 = (uint)uVar8 * 3;
    uVar7 = (ulong)uVar15;
    if (0x21 < (uint)uVar8) {
      return uVar15;
    }
  } while( true );
}

Assistant:

static int run_many_negation_range_tests_simpler(bool inplace) {
    for (int h = 1; h < 100; h *= 3) {
        printf("h=%d\n", h);
        for (int k = h + 1; k < 100; k = k * 1.5 + 1) {
            printf("  k=%d\n", k);
            for (int start_offset = 0; start_offset < 1000;
                 start_offset = start_offset * 2.7 + 1) {
                for (int r_start = 0; r_start < 65535; r_start += 10013)
                    for (int span = 0; r_start + span < 65536;
                         span = span * 3 + 1) {
                        run_negation_range_tests_simpler(
                            k, h, start_offset, r_start, r_start + span,
                            inplace);
                    }
            }
        }
    }
    return 1;
}